

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::toggleDecode
          (SRGBTestCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
          *uniformDataList)

{
  SRGBTestTexture *this_00;
  SRGBDecode SVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference ppSVar4;
  int local_1c;
  int uniformIdx;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
  *uniformDataList_local;
  SRGBTestCase *this_local;
  
  for (local_1c = 0;
      sVar2 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
              ::size(uniformDataList), local_1c < (int)sVar2; local_1c = local_1c + 1) {
    pvVar3 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
             ::operator[](uniformDataList,(long)local_1c);
    if ((pvVar3->toggleDecode & 1U) == 1) {
      ppSVar4 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                ::operator[](&this->m_textureSourceList,(long)local_1c);
      SVar1 = SRGBTestTexture::getDecode(*ppSVar4);
      if (SVar1 != SRGBDECODE_DECODE_DEFAULT) {
        ppSVar4 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                  ::operator[](&this->m_textureSourceList,(long)local_1c);
        this_00 = *ppSVar4;
        ppSVar4 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
                  ::operator[](&this->m_textureSourceList,(long)local_1c);
        SVar1 = SRGBTestTexture::getDecode(*ppSVar4);
        SRGBTestTexture::setDecode(this_00,(int)(SVar1 + SRGBDECODE_DECODE) % 2);
      }
    }
  }
  return;
}

Assistant:

void SRGBTestCase::toggleDecode (const std::vector<UniformData>& uniformDataList)
{
	DE_ASSERT( uniformDataList.size() <= m_textureSourceList.size() );

	for (int uniformIdx = 0; uniformIdx < (int)uniformDataList.size(); uniformIdx++)
	{
		if (uniformDataList[uniformIdx].toggleDecode == true)
		{
			if (m_textureSourceList[uniformIdx]->getDecode() == SRGBDECODE_DECODE_DEFAULT)
			{
				// cannot toggle default
				continue;
			}

			// toggle sRGB decode values (ignoring value if set to default)
			m_textureSourceList[uniformIdx]->setDecode((SRGBDecode)((m_textureSourceList[uniformIdx]->getDecode() + 1) % SRGBDECODE_DECODE_DEFAULT));
		}
	}
}